

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

void tree_close(tree *t)

{
  tree *t_local;
  
  if (t != (tree *)0x0) {
    if (-1 < t->entry_fd) {
      close_and_restore_time(t->entry_fd,t,&t->restore_time);
      t->entry_fd = -1;
    }
    if (t->d != (DIR *)0x0) {
      closedir((DIR *)t->d);
      t->d = (DIR *)0x0;
    }
    while (t->stack != (tree_entry *)0x0) {
      if ((t->stack->flags & 2U) != 0) {
        close(t->stack->symlink_parent_fd);
      }
      tree_pop(t);
    }
    if (-1 < t->working_dir_fd) {
      close(t->working_dir_fd);
      t->working_dir_fd = -1;
    }
    if (-1 < t->initial_dir_fd) {
      close(t->initial_dir_fd);
      t->initial_dir_fd = -1;
    }
  }
  return;
}

Assistant:

static void
tree_close(struct tree *t)
{

	if (t == NULL)
		return;
	if (t->entry_fd >= 0) {
		close_and_restore_time(t->entry_fd, t, &t->restore_time);
		t->entry_fd = -1;
	}
	/* Close the handle of readdir(). */
	if (t->d != INVALID_DIR_HANDLE) {
		closedir(t->d);
		t->d = INVALID_DIR_HANDLE;
	}
	/* Release anything remaining in the stack. */
	while (t->stack != NULL) {
		if (t->stack->flags & isDirLink)
			close(t->stack->symlink_parent_fd);
		tree_pop(t);
	}
	if (t->working_dir_fd >= 0) {
		close(t->working_dir_fd);
		t->working_dir_fd = -1;
	}
	if (t->initial_dir_fd >= 0) {
		close(t->initial_dir_fd);
		t->initial_dir_fd = -1;
	}
}